

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<chatra::Node> __thiscall
chatra::
extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          *it,__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              last,StatementPatternElement *e)

{
  Token *token;
  bool bVar1;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var2;
  reference ppTVar3;
  string *message;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  shared_ptr<chatra::Node> sVar5;
  byte local_369;
  bool local_2d2;
  bool local_2d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  Token **local_2a0;
  Token **local_298;
  Token **local_290;
  byte local_281;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_280 [2];
  ParserContext *local_270;
  Token **local_268;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_260;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  itBoundary_1;
  shared_ptr<chatra::Node> local_248;
  ParserContext *local_230;
  byte local_221;
  shared_ptr<chatra::Node> local_220;
  shared_ptr<chatra::Node> local_210;
  ParserContext *local_1f8;
  byte local_1e9;
  shared_ptr<chatra::Node> local_1e8;
  shared_ptr<chatra::Node> local_1d8;
  ParserContext *local_1c0;
  byte local_1b1;
  shared_ptr<chatra::Node> local_1b0;
  shared_ptr<chatra::Node> local_1a0;
  ParserContext *local_188;
  byte local_179;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_178;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  itExp;
  shared_ptr<chatra::Node> local_158;
  byte local_141;
  shared_ptr<chatra::Node> local_140;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_130;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  itHint;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_108;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  itBoundary;
  shared_ptr<chatra::Node> local_f0;
  ParserContext *local_d8;
  byte local_c9;
  int local_c8;
  ParserContext *local_c0;
  byte local_b5;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_a8;
  shared_ptr<chatra::Node> local_a0;
  undefined1 local_89;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_88;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_80;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_78;
  undefined1 local_69;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_68;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_60;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_58;
  Token **local_50;
  Token **local_48;
  ulong local_40;
  size_t leftTokens;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  it0;
  StatementPatternElement *e_local;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  *it_local;
  ParserContext *ct_local;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_local;
  shared_ptr<chatra::Node> *n;
  
  leftTokens = (size_t)it->_M_current;
  local_48 = it->_M_current;
  local_50 = last._M_current;
  it0._M_current = (Token **)e;
  ct_local = (ParserContext *)last._M_current;
  last_local._M_current = (Token **)this;
  local_40 = std::
             distance<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                       ((__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                         )local_48,last);
  switch(*(undefined4 *)it0._M_current) {
  case 0:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,*(StringId *)((long)it0._M_current + 4));
    if (bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                 ::operator++(it,0);
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(&local_58);
      sVar5 = createNameNode(this,*ppTVar3);
      _Var4 = sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_00275048;
    }
    break;
  case 1:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,Name);
    if (bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                 ::operator++(it,0);
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(&local_60);
      sVar5 = createNameNode(this,*ppTVar3);
      _Var4 = sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_00275048;
    }
    break;
  case 2:
    local_2d1 = false;
    if (1 < local_40) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(it);
      bVar1 = matches(*ppTVar3,OpElementSelection);
      local_2d1 = false;
      if (bVar1) {
        local_68 = __gnu_cxx::
                   __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                   ::operator+(it,1);
        ppTVar3 = __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator*(&local_68);
        local_2d1 = matches(*ppTVar3,Name);
      }
    }
    if (local_2d1 != false) {
      local_69 = 0;
      local_78 = __gnu_cxx::
                 __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                 ::operator+(it,1);
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(&local_78);
      createNameNode(this,*ppTVar3);
      __gnu_cxx::
      __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
      ::operator+=(it,2);
      _Var4._M_pi = extraout_RDX;
      goto LAB_00275048;
    }
    break;
  case 3:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,Name);
    if (bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                 ::operator++(it,0);
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(&local_80);
      sVar5 = createNameNode(this,*ppTVar3);
      _Var4 = sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_00275048;
    }
    break;
  case 4:
    local_2d2 = false;
    if (1 < local_40) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(it);
      bVar1 = matches(*ppTVar3,Name);
      local_2d2 = false;
      if (bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                   ::operator+(it,1);
        ppTVar3 = __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator*(&local_88);
        local_2d2 = matches(*ppTVar3,Colon);
      }
    }
    if (local_2d2 != false) {
      local_89 = 0;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(it);
      createNameNode(this,*ppTVar3);
      __gnu_cxx::
      __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
      ::operator+=(it,2);
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_00275048;
    }
    break;
  case 5:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,Static);
    if (bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                 ::operator++(it,0);
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(&local_a8);
      createNameNode((chatra *)&local_a0,*ppTVar3);
      wrapByTuple(this,&local_a0,(Token *)0x0);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_a0);
      _Var4._M_pi = extraout_RDX_01;
      goto LAB_00275048;
    }
    break;
  case 6:
    local_b5 = 0;
    local_c0 = ct_local;
    extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_1_>
              (this,ct,it,ct_local);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      local_b5 = 1;
      local_c8 = 1;
    }
    else {
      local_c8 = 2;
    }
    _Var4._M_pi = extraout_RDX_02;
    if ((local_b5 & 1) == 0) {
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_03;
    }
    goto joined_r0x00274f73;
  case 7:
    local_c9 = 0;
    local_d8 = ct_local;
    extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_2_>
              (this,ct,it,ct_local);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      bVar1 = isOperator((shared_ptr<chatra::Node> *)this,Pair);
      _Var4._M_pi = extraout_RDX_05;
      if (bVar1) {
        std::shared_ptr<chatra::Node>::shared_ptr
                  ((shared_ptr<chatra::Node> *)&itBoundary,(shared_ptr<chatra::Node> *)this);
        wrapByTuple((chatra *)&local_f0,(shared_ptr<chatra::Node> *)&itBoundary,(Token *)0x0);
        std::shared_ptr<chatra::Node>::operator=((shared_ptr<chatra::Node> *)this,&local_f0);
        std::shared_ptr<chatra::Node>::~shared_ptr(&local_f0);
        std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)&itBoundary);
        _Var4._M_pi = extraout_RDX_06;
      }
      local_c9 = 1;
      local_c8 = 1;
    }
    else {
      local_c8 = 2;
      _Var4._M_pi = extraout_RDX_04;
    }
    if ((local_c9 & 1) == 0) {
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_07;
    }
    goto joined_r0x00274f73;
  case 8:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,OpenParenthesis);
    if (bVar1) {
      _Var2 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator+(it,1);
      local_108 = findExpressionBoundary<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_3_>
                            (ct,_Var2._M_current,ct_local);
      bVar1 = __gnu_cxx::operator==
                        (&local_108,
                         (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                          *)&ct_local);
      if (!bVar1) {
        ppTVar3 = __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator*(&local_108);
        bVar1 = matches(*ppTVar3,CloseParenthesis);
        if (bVar1) {
          itHint = __gnu_cxx::
                   __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                   ::operator+(it,1);
          bVar1 = __gnu_cxx::operator==(&local_108,&itHint);
          if (bVar1) {
            local_130 = (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                         )it->_M_current;
            __gnu_cxx::
            __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
            ::operator+=(it,2);
            std::shared_ptr<chatra::Node>::shared_ptr(&local_140,(nullptr_t)0x0);
            ppTVar3 = __gnu_cxx::
                      __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                      ::operator*(&local_130);
            wrapByTuple(this,&local_140,*ppTVar3);
            std::shared_ptr<chatra::Node>::~shared_ptr(&local_140);
            _Var4._M_pi = extraout_RDX_08;
            goto LAB_00275048;
          }
          local_141 = 0;
          _Var2 = __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator+(it,1);
          parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    ((chatra *)&local_158,ct,_Var2,local_108);
          wrapByTuple(this,&local_158,(Token *)0x0);
          std::shared_ptr<chatra::Node>::~shared_ptr(&local_158);
          bVar1 = checkAsParameterList(ct,(shared_ptr<chatra::Node> *)this);
          if (bVar1) {
            itExp = __gnu_cxx::
                    __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    ::operator+(&local_108,1);
            it->_M_current = (Token **)itExp;
            local_141 = 1;
            local_c8 = 1;
            _Var4._M_pi = extraout_RDX_10;
          }
          else {
            local_c8 = 2;
            _Var4._M_pi = extraout_RDX_09;
          }
          if ((local_141 & 1) == 0) {
            std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
            _Var4._M_pi = extraout_RDX_11;
          }
          goto joined_r0x00274f73;
        }
      }
    }
    break;
  case 9:
    if (1 < local_40) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator*(it);
      bVar1 = matches(*ppTVar3,As);
      if (bVar1) {
        local_178 = __gnu_cxx::
                    __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    ::operator+(it,1);
        local_179 = 0;
        local_188 = ct_local;
        extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_4_>
                  (this,ct,&local_178,ct_local);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
        if (bVar1) {
          std::shared_ptr<chatra::Node>::shared_ptr(&local_1b0,(shared_ptr<chatra::Node> *)this);
          wrapByTuple((chatra *)&local_1a0,&local_1b0,(Token *)0x0);
          std::shared_ptr<chatra::Node>::operator=((shared_ptr<chatra::Node> *)this,&local_1a0);
          std::shared_ptr<chatra::Node>::~shared_ptr(&local_1a0);
          std::shared_ptr<chatra::Node>::~shared_ptr(&local_1b0);
          bVar1 = checkAsQualifiers(ct,(shared_ptr<chatra::Node> *)this);
          _Var4._M_pi = extraout_RDX_13;
          if (bVar1) {
            it->_M_current = (Token **)local_178;
            local_179 = 1;
            local_c8 = 1;
          }
          else {
            local_c8 = 2;
          }
        }
        else {
          local_c8 = 2;
          _Var4._M_pi = extraout_RDX_12;
        }
        if ((local_179 & 1) == 0) {
          std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
          _Var4._M_pi = extraout_RDX_14;
        }
        goto joined_r0x00274f73;
      }
    }
    break;
  case 10:
    local_1b1 = 0;
    local_1c0 = ct_local;
    extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_5_>
              (this,ct,it,ct_local);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      std::shared_ptr<chatra::Node>::shared_ptr(&local_1e8,(shared_ptr<chatra::Node> *)this);
      wrapByTuple((chatra *)&local_1d8,&local_1e8,(Token *)0x0);
      std::shared_ptr<chatra::Node>::operator=((shared_ptr<chatra::Node> *)this,&local_1d8);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_1d8);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_1e8);
      bVar1 = checkAsClassList(ct,(shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_16;
      if (bVar1) {
        local_1b1 = 1;
        local_c8 = 1;
      }
      else {
        local_c8 = 2;
      }
    }
    else {
      local_c8 = 2;
      _Var4._M_pi = extraout_RDX_15;
    }
    if ((local_1b1 & 1) == 0) {
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_17;
    }
    goto joined_r0x00274f73;
  case 0xb:
    local_1e9 = 0;
    local_1f8 = ct_local;
    extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_6_>
              (this,ct,it,ct_local);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      std::shared_ptr<chatra::Node>::shared_ptr(&local_220,(shared_ptr<chatra::Node> *)this);
      wrapByTuple((chatra *)&local_210,&local_220,(Token *)0x0);
      std::shared_ptr<chatra::Node>::operator=((shared_ptr<chatra::Node> *)this,&local_210);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_210);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_220);
      bVar1 = checkAsVarDefinitions(ct,(shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_19;
      if (bVar1) {
        local_1e9 = 1;
        local_c8 = 1;
      }
      else {
        local_c8 = 2;
      }
    }
    else {
      local_c8 = 2;
      _Var4._M_pi = extraout_RDX_18;
    }
    if ((local_1e9 & 1) == 0) {
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_20;
    }
    goto joined_r0x00274f73;
  case 0xc:
    local_221 = 0;
    local_230 = ct_local;
    extractExpression<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_7_>
              (this,ct,it,ct_local);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      std::shared_ptr<chatra::Node>::shared_ptr
                ((shared_ptr<chatra::Node> *)&itBoundary_1,(shared_ptr<chatra::Node> *)this);
      wrapByTuple((chatra *)&local_248,(shared_ptr<chatra::Node> *)&itBoundary_1,(Token *)0x0);
      std::shared_ptr<chatra::Node>::operator=((shared_ptr<chatra::Node> *)this,&local_248);
      std::shared_ptr<chatra::Node>::~shared_ptr(&local_248);
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)&itBoundary_1);
      local_221 = 1;
      local_c8 = 1;
      _Var4._M_pi = extraout_RDX_22;
    }
    else {
      local_c8 = 2;
      _Var4._M_pi = extraout_RDX_21;
    }
    if ((local_221 & 1) == 0) {
      std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
      _Var4._M_pi = extraout_RDX_23;
    }
joined_r0x00274f73:
    if (local_c8 == 1) goto LAB_00275048;
    break;
  case 0xd:
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*(it);
    bVar1 = matches(*ppTVar3,OpenParenthesis);
    if (bVar1) {
      local_268 = (Token **)
                  __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator+(it,1);
      local_270 = ct_local;
      local_260 = findExpressionBoundary<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>(chatra::ParserContext&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>&,__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,chatra::StatementPatternElement_const&)::_lambda(chatra::Token_const&)_8_>
                            (ct,local_268,ct_local);
      local_280[0] = __gnu_cxx::
                     __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                     ::operator+(it,1);
      bVar1 = __gnu_cxx::operator==(&local_260,local_280);
      local_369 = 1;
      if (!bVar1) {
        bVar1 = __gnu_cxx::operator==
                          (&local_260,
                           (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                            *)&ct_local);
        local_369 = 1;
        if (!bVar1) {
          ppTVar3 = __gnu_cxx::
                    __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    ::operator*(&local_260);
          bVar1 = matches(*ppTVar3,CloseParenthesis);
          local_369 = bVar1 ^ 0xff;
        }
      }
      if ((local_369 & 1) == 0) {
        local_281 = 0;
        local_290 = (Token **)
                    __gnu_cxx::
                    __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    ::operator+(it,1);
        local_298 = local_260._M_current;
        parseOperatorParameter<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  (this,ct,(__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                            )local_290,local_260);
        bVar1 = checkAsOperatorParameter(ct,(shared_ptr<chatra::Node> *)this);
        if (bVar1) {
          local_2a0 = (Token **)
                      __gnu_cxx::
                      __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                      ::operator+(&local_260,1);
          it->_M_current = local_2a0;
          local_281 = 1;
          local_c8 = 1;
          _Var4._M_pi = extraout_RDX_25;
        }
        else {
          local_c8 = 2;
          _Var4._M_pi = extraout_RDX_24;
        }
        if ((local_281 & 1) == 0) {
          std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)this);
          _Var4._M_pi = extraout_RDX_26;
        }
        goto joined_r0x00274f73;
      }
    }
  }
  if (((ulong)it0._M_current[1] & 1) != 0) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
              ::operator*((__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                           *)&leftTokens);
    token = *ppTVar3;
    message = (string *)(it0._M_current + 3);
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2b8);
    ParserContext::errorAtToken(ct,Error,token,message,&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
  }
  std::shared_ptr<chatra::Node>::shared_ptr((shared_ptr<chatra::Node> *)this,(nullptr_t)0x0);
  _Var4._M_pi = extraout_RDX_27;
LAB_00275048:
  sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar5.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> extractStatementPiece(ParserContext& ct, TokenPtrIterator& it, TokenPtrIterator last,
		const StatementPatternElement& e) {

	chatra_assert(it != last);
	auto it0 = it;
	auto leftTokens = static_cast<size_t>(std::distance(it, last));

	switch (e.type) {
	case StPt::Token:
		if (matches(**it, e.token))
			return createNameNode(**it++);
		break;

	case StPt::Name:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::VariationName:
		if (leftTokens >= 2 && matches(**it, StringId::OpElementSelection) && matches(**(it + 1), TokenType::Name)) {
			// Variation name is distinguishable from reserved words since it is always used with prefixed ".";
			// No checks performed.
			auto n = createNameNode(**(it + 1));
			it += 2;
			return n;
		}
		break;

	case StPt::Label:
		if (matches(**it, TokenType::Name))
			return createNameNode(**it++);
		break;

	case StPt::LabelWithColon:
		if (leftTokens >= 2 && matches(**it, TokenType::Name) && matches(**(it + 1), StringId::Colon)) {
			auto n = createNameNode(**it);
			it += 2;
			return n;
		}
		break;

	case StPt::StorageClassSpecifier:
		// Currently only supports "static"
		if (matches(**it, StringId::Static))
			return wrapByTuple(createNameNode(**it++));
		break;

	case StPt::Expression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		return n;
	}

	case StPt::TupleExpression: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		if (isOperator(n, Operator::Pair))
			n = wrapByTuple(n);
		return n;
	}

	case StPt::ParameterList:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
					return matches(token, StringId::CloseParenthesis); });
			// Empty parameter list means "void" function, so it should be accepted
			if (itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;
			if (itBoundary == it + 1) {
				auto itHint = it;
				it += 2;
				return wrapByTuple(nullptr, *itHint);
			}

			auto n = wrapByTuple(parseExpression(ct, it + 1, itBoundary));
			if (!checkAsParameterList(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;

	case StPt::Qualifiers:
		if (leftTokens >= 2 && matches(**it, StringId::As)) {
			auto itExp = it + 1;
			auto n = extractExpression(ct, itExp, last, [](const Token& token) { (void)token; return false; });
			if (!n)
				break;
			n = wrapByTuple(n);
			if (!checkAsQualifiers(ct, n))
				break;
			it = itExp;
			return n;
		}
		break;

	case StPt::ClassList: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { (void)token; return false; });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsClassList(ct, n))
			break;
		return n;
	}

	case StPt::VarDefinitions: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::As); });
		if (!n)
			break;
		n = wrapByTuple(n);
		if (!checkAsVarDefinitions(ct, n))
			break;
		return n;
	}

	case StPt::ForLoopVariables: {
		auto n = extractExpression(ct, it, last, [](const Token& token) { return matches(token, StringId::In); });
		if (!n)
			break;
		n = wrapByTuple(n);
		// if (!checkAsForLoopVariables(ct, n))
		// 	break;
		return n;
	}

	case StPt::OperatorParameter:
		if (matches(**it, StringId::OpenParenthesis)) {
			auto itBoundary = findExpressionBoundary(ct, it + 1, last, [](const Token& token) {
				return matches(token, StringId::CloseParenthesis); });
			if (itBoundary == it + 1 || itBoundary == last || !matches(**itBoundary, StringId::CloseParenthesis))
				break;

			auto n = parseOperatorParameter(ct, it + 1, itBoundary);
			if (!checkAsOperatorParameter(ct, n))
				break;
			it = itBoundary + 1;
			return n;
		}
		break;
	}

	if (e.required) {
		chatra_assert(!e.errorMessage.empty());
		ct.errorAtToken(ErrorLevel::Error, **it0, e.errorMessage, {});
	}

	return nullptr;
}